

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLT.h
# Opt level: O3

Index Eigen::internal::llt_inplace<double,1>::unblocked<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                (Matrix<double,__1,__1,_0,__1,__1> *mat)

{
  ResScalar *res;
  double *pdVar1;
  long lVar2;
  ulong uVar3;
  double *pdVar4;
  char *__function;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  Index size;
  ulong uVar12;
  ulong cols;
  double dVar13;
  undefined8 extraout_XMM0_Qb;
  double dVar14;
  undefined1 auVar15 [16];
  undefined4 uVar16;
  undefined4 uVar17;
  const_blas_data_mapper<double,_long,_0> local_a0;
  const_blas_data_mapper<double,_long,_1> local_90;
  ulong local_80;
  undefined1 local_78 [16];
  long local_60;
  long local_58;
  ulong local_50;
  Matrix<double,__1,__1,_0,__1,__1> *local_48;
  long local_40;
  long local_38;
  
  uVar7 = (mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if (uVar7 != (mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_cols) {
    __assert_fail("mat.rows()==mat.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Cholesky/LLT.h"
                  ,0x136,
                  "static Index Eigen::internal::llt_inplace<double, 1>::unblocked(MatrixType &) [Scalar = double, UpLo = 1, MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if (0 < (long)uVar7) {
    lVar10 = -1;
    lVar11 = 8;
    lVar5 = 0;
    cols = 0;
    local_80 = uVar7;
    local_50 = uVar7;
    local_48 = mat;
    do {
      pdVar1 = (mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      uVar12 = ~cols + local_50;
      if ((long)uVar12 < 0 && pdVar1 != (double *)0x0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Core/MapBase.h"
                      ,0xb0,
                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1>, Level = 0]"
                     );
      }
      if ((((long)uVar12 < 0) ||
          (lVar2 = (mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                   .m_rows, (long)(lVar2 - uVar12) <= (long)cols)) ||
         ((mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
          <= (long)cols)) {
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
        ;
LAB_001133c7:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Core/Block.h"
                      ,0x93,__function);
      }
      local_40 = lVar5;
      if (lVar2 <= (long)cols) {
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
        ;
        goto LAB_001133c7;
      }
      pdVar9 = pdVar1 + cols;
      dVar13 = pdVar1[lVar2 * cols + cols];
      if (cols != 0) {
        dVar14 = *pdVar9 * *pdVar9;
        if (cols != 1) {
          pdVar4 = (double *)(lVar5 + lVar2 * 8 + (long)pdVar1);
          lVar5 = lVar10;
          do {
            dVar14 = dVar14 + *pdVar4 * *pdVar4;
            pdVar4 = pdVar4 + lVar2;
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
        }
        dVar13 = dVar13 - dVar14;
      }
      if (dVar13 <= 0.0) {
        return cols;
      }
      local_60 = lVar10;
      local_58 = lVar11;
      local_38 = lVar2;
      if (dVar13 < 0.0) {
        local_78._0_8_ = pdVar9;
        dVar13 = sqrt(dVar13);
        uVar16 = (undefined4)extraout_XMM0_Qb;
        uVar17 = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
        mat = local_48;
        pdVar9 = (double *)local_78._0_8_;
      }
      else {
        uVar16 = 0;
        uVar17 = 0;
        dVar13 = SQRT(dVar13);
      }
      res = pdVar1 + cols + 1 + lVar2 * cols;
      lVar5 = (mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows;
      (mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
      [lVar5 * cols + cols] = dVar13;
      if (uVar12 == 0 || cols == 0) {
        if (uVar12 != 0) goto LAB_001132a4;
      }
      else {
        local_78._8_4_ = uVar16;
        local_78._0_8_ = dVar13;
        local_78._12_4_ = uVar17;
        local_a0.super_blas_data_mapper<const_double,_long,_0,_0>.m_data = pdVar1 + cols + 1;
        local_a0.super_blas_data_mapper<const_double,_long,_0,_0>.m_stride = local_38;
        local_90.super_blas_data_mapper<const_double,_long,_1,_0>.m_data = pdVar9;
        local_90.super_blas_data_mapper<const_double,_long,_1,_0>.m_stride = lVar5;
        general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
        ::run(uVar12,cols,&local_a0,&local_90,res,1,-1.0);
        mat = local_48;
        dVar13 = (double)local_78._0_8_;
LAB_001132a4:
        uVar3 = (ulong)((uint)((ulong)res >> 3) & 1);
        if (((ulong)res & 7) != 0) {
          uVar3 = uVar12;
        }
        if (uVar3 != 0) {
          lVar5 = local_38 * local_40 + local_58;
          uVar6 = 0;
          do {
            *(double *)((long)pdVar1 + uVar6 * 8 + lVar5) =
                 *(double *)((long)pdVar1 + uVar6 * 8 + lVar5) / dVar13;
            uVar6 = uVar6 + 1;
          } while (uVar3 != uVar6);
        }
        lVar10 = uVar12 - uVar3;
        uVar6 = lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffe;
        lVar5 = uVar6 + uVar3;
        if (1 < lVar10) {
          lVar10 = (local_38 + 1) * local_40;
          uVar8 = uVar3;
          do {
            auVar15._8_8_ = dVar13;
            auVar15._0_8_ = dVar13;
            auVar15 = divpd(*(undefined1 (*) [16])((long)pdVar1 + uVar8 * 8 + lVar10 + 8),auVar15);
            *(undefined1 (*) [16])((long)pdVar1 + uVar8 * 8 + lVar10 + 8) = auVar15;
            uVar8 = uVar8 + 2;
          } while ((long)uVar8 < lVar5);
        }
        if (lVar5 < (long)uVar12) {
          uVar12 = uVar3 + uVar6 + 1;
          lVar5 = (local_38 + 1) * local_40;
          do {
            *(double *)((long)pdVar1 + uVar12 * 8 + lVar5) =
                 *(double *)((long)pdVar1 + uVar12 * 8 + lVar5) / dVar13;
            uVar12 = uVar12 + 1;
          } while (uVar7 != uVar12);
        }
      }
      cols = cols + 1;
      lVar10 = local_60 + 1;
      lVar5 = local_40 + 8;
      lVar11 = local_58 + 8;
      uVar7 = uVar7 - 1;
    } while (cols != local_80);
  }
  return -1;
}

Assistant:

static Index unblocked(MatrixType& mat)
  {
    using std::sqrt;

    eigen_assert(mat.rows()==mat.cols());
    const Index size = mat.rows();
    for(Index k = 0; k < size; ++k)
    {
      Index rs = size-k-1; // remaining size

      Block<MatrixType,Dynamic,1> A21(mat,k+1,k,rs,1);
      Block<MatrixType,1,Dynamic> A10(mat,k,0,1,k);
      Block<MatrixType,Dynamic,Dynamic> A20(mat,k+1,0,rs,k);

      RealScalar x = numext::real(mat.coeff(k,k));
      if (k>0) x -= A10.squaredNorm();
      if (x<=RealScalar(0))
        return k;
      mat.coeffRef(k,k) = x = sqrt(x);
      if (k>0 && rs>0) A21.noalias() -= A20 * A10.adjoint();
      if (rs>0) A21 /= x;
    }
    return -1;
  }